

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDUint32x4Operation::OpFromFloat32x4(SIMDValue *value,bool *throws)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  _x86_SIMDValue _Var4;
  int mask;
  X86SIMDValue two_31_i4;
  X86SIMDValue two_31_f4;
  X86SIMDValue temp2;
  X86SIMDValue temp;
  X86SIMDValue v;
  X86SIMDValue x86Result;
  bool *throws_local;
  SIMDValue *value_local;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  ulong local_138;
  ulong uStack_130;
  ulong local_118;
  ulong uStack_110;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_28;
  int iStack_24;
  
  v.field_0.f64[1] = 0.0;
  _Var4 = _x86_SIMDValue::ToX86SIMDValue(value);
  local_168 = _Var4.field_0._0_4_;
  fStack_164 = _Var4.field_0._4_4_;
  fStack_160 = _Var4.field_0._8_4_;
  fStack_15c = _Var4.field_0._12_4_;
  local_178 = X86_ALL_NEG_ONES_F4.field_0._0_4_;
  fStack_174 = X86_ALL_NEG_ONES_F4.field_0._4_4_;
  fStack_170 = X86_ALL_NEG_ONES_F4.field_0._8_4_;
  fStack_16c = X86_ALL_NEG_ONES_F4.field_0._12_4_;
  auVar2._4_4_ = -(uint)(fStack_164 <= fStack_174);
  auVar2._0_4_ = -(uint)(local_168 <= local_178);
  auVar2._12_4_ = -(uint)(fStack_15c <= fStack_16c);
  auVar2._8_4_ = -(uint)(fStack_160 <= fStack_170);
  iVar3 = movmskps(local_168,auVar2);
  if (iVar3 == 0) {
    local_118 = X86_TWO_31_F4.field_0._0_8_;
    uStack_110 = X86_TWO_31_F4.field_0._8_8_;
    local_f8 = X86_TWO_31_F4.field_0._0_4_;
    fStack_f4 = X86_TWO_31_F4.field_0._4_4_;
    fStack_f0 = X86_TWO_31_F4.field_0._8_4_;
    fStack_ec = X86_TWO_31_F4.field_0._12_4_;
    two_31_i4.field_0.i64[1] =
         local_118 & CONCAT44(-(uint)(fStack_f4 <= fStack_164),-(uint)(local_f8 <= local_168));
    uStack_110 = uStack_110 &
                 CONCAT44(-(uint)(fStack_ec <= fStack_15c),-(uint)(fStack_f0 <= fStack_160));
    local_b8 = (float)two_31_i4.field_0.i64[1];
    fStack_b4 = (float)((ulong)two_31_i4.field_0.i64[1] >> 0x20);
    fStack_b0 = (float)uStack_110;
    fStack_ac = (float)(uStack_110 >> 0x20);
    v.field_0.i32[2] = (Type)(local_168 - local_b8);
    v.field_0.i32[3] = (Type)(fStack_164 - fStack_b4);
    local_88 = X86_NEG_MASK_F4.field_0._0_4_;
    iStack_84 = X86_NEG_MASK_F4.field_0._4_4_;
    iStack_80 = X86_NEG_MASK_F4.field_0._8_4_;
    iStack_7c = X86_NEG_MASK_F4.field_0._12_4_;
    auVar1._4_4_ = -(uint)(v.field_0.i32[3] == iStack_84);
    auVar1._0_4_ = -(uint)(v.field_0.i32[2] == local_88);
    auVar1._12_4_ = -(uint)((int)(fStack_15c - fStack_ac) == iStack_7c);
    auVar1._8_4_ = -(uint)((int)(fStack_160 - fStack_b0) == iStack_80);
    iVar3 = movmskps((int)&two_31_i4 + 8,auVar1);
    if (iVar3 == 0) {
      local_138 = X86_TWO_31_I4.field_0._0_8_;
      uStack_130 = X86_TWO_31_I4.field_0._8_8_;
      two_31_i4.field_0.f32[3] = fStack_b4;
      two_31_i4.field_0.u32[2] = (int)local_b8 << 1;
      two_31_i4.field_0.i64[0] = uStack_130 & uStack_110;
      local_28 = (int)(local_138 & two_31_i4.field_0.i64[1]);
      iStack_24 = (int)((local_138 & two_31_i4.field_0.i64[1]) >> 0x20);
      v.field_0.i32[3] = v.field_0.i32[3] + iStack_24;
      v.field_0.i32[2] = v.field_0.i32[2] + local_28;
      _value_local = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
                     _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
    }
    else {
      *throws = true;
      _value_local = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
                     _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
    }
  }
  else {
    *throws = true;
    _value_local = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
                   _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
  }
  return (SIMDValue)_value_local;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpFromFloat32x4(const SIMDValue& value, bool& throws)
    {
        X86SIMDValue x86Result = { 0 };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);
        X86SIMDValue temp, temp2;
        X86SIMDValue two_31_f4, two_31_i4;
        int mask = 0;

        // any lanes <= -1.0 ?
        temp.m128_value = _mm_cmple_ps(v.m128_value, X86_ALL_NEG_ONES_F4.m128_value);
        mask = _mm_movemask_ps(temp.m128_value);
        // negative value are out of range, caller should throw Range Error
        if (mask)
        {
            throws = true;
            return X86SIMDValue::ToSIMDValue(x86Result);
        }
        // CVTTPS2DQ does a range check over signed range [-2^31, 2^31-1], so will fail to convert values >= 2^31.
        // To fix this, subtract 2^31 from values >= 2^31, do CVTTPS2DQ, then add 2^31 back.
        _mm_store_ps(two_31_f4.f32, X86_TWO_31_F4.m128_value);
        // any lanes >= 2^31 ?
        temp.m128_value = _mm_cmpge_ps(v.m128_value, two_31_f4.m128_value);
        // two_31_f4 has f32(2^31) for lanes >= 2^31, 0 otherwise
        two_31_f4.m128_value = _mm_and_ps(two_31_f4.m128_value, temp.m128_value);
        // subtract 2^31 from lanes >= 2^31, unchanged otherwise.
        v.m128_value = _mm_sub_ps(v.m128_value, two_31_f4.m128_value);

        // CVTTPS2DQ
        x86Result.m128i_value = _mm_cvttps_epi32(v.m128_value);

        // check if any value is out of range (i.e. >= 2^31, meaning originally >= 2^32 before value adjustment)
        temp2.m128i_value = _mm_cmpeq_epi32(x86Result.m128i_value, X86_NEG_MASK_F4.m128i_value); // any value == 0x80000000 ?
        mask = _mm_movemask_ps(temp2.m128_value);
        if (mask)
        {
            throws = true;
            return X86SIMDValue::ToSIMDValue(x86Result);
        }
        // we pass range check

        // add 2^31 values back to adjusted values.
        // Use first bit from the 2^31 float mask (0x4f000...0 << 1)
        // and result with 2^31 int mask (0x8000..0) setting first bit to zero if lane hasn't been adjusted
        _mm_store_ps(two_31_i4.f32, X86_TWO_31_I4.m128_value);
        two_31_f4.m128i_value = _mm_slli_epi32(two_31_f4.m128i_value, 1);
        two_31_i4.m128i_value = _mm_and_si128(two_31_i4.m128i_value, two_31_f4.m128i_value);
        // add 2^31 back to adjusted values
        // Note at this point all values are in [0, 2^31-1]. Adding 2^31 is guaranteed not to overflow.
        x86Result.m128i_value = _mm_add_epi32(x86Result.m128i_value, two_31_i4.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }